

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

int Dsd_TreeCollectDecomposableVars(Dsd_Manager_t *pDsdMan,int *pVars)

{
  int *in_RCX;
  int nVars;
  int local_c;
  
  local_c = 0;
  Dsd_TreeCollectDecomposableVars_rec
            ((DdManager *)((ulong)*pDsdMan->pRoots & 0xfffffffffffffffe),(Dsd_Node_t *)pVars,
             &local_c,in_RCX);
  return local_c;
}

Assistant:

int Dsd_TreeCollectDecomposableVars( Dsd_Manager_t * pDsdMan, int * pVars )
{
    int nVars;

    // set the vars collected to 0
    nVars = 0;
    Dsd_TreeCollectDecomposableVars_rec( pDsdMan->dd, Dsd_Regular(pDsdMan->pRoots[0]), pVars, &nVars );
    // return the number of collected vars
    return nVars;
}